

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O2

uint pseudo_median<unsigned_int>(uchar **strings,size_t N,size_t depth)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint b;
  uint c;
  ulong uVar5;
  
  uVar1 = get_char<unsigned_int>(*strings,depth);
  if (N < 0x1f) {
    b = get_char<unsigned_int>(*(uchar **)((long)strings + (N & 0xfffffffffffffffe) * 4),depth);
    c = get_char<unsigned_int>(strings[N - 1],depth);
  }
  else {
    uVar2 = get_char<unsigned_int>(strings[1],depth);
    uVar3 = get_char<unsigned_int>(strings[2],depth);
    uVar1 = med3char<unsigned_int>(uVar1,uVar2,uVar3);
    uVar5 = N & 0xfffffffffffffffe;
    uVar2 = get_char<unsigned_int>(*(uchar **)((long)strings + uVar5 * 4),depth);
    uVar3 = get_char<unsigned_int>(*(uchar **)((long)strings + uVar5 * 4 + 8),depth);
    uVar4 = get_char<unsigned_int>(*(uchar **)((long)strings + uVar5 * 4 + 0x10),depth);
    b = med3char<unsigned_int>(uVar2,uVar3,uVar4);
    uVar2 = get_char<unsigned_int>(strings[N - 3],depth);
    uVar3 = get_char<unsigned_int>(strings[N - 2],depth);
    uVar4 = get_char<unsigned_int>(strings[N - 1],depth);
    c = med3char<unsigned_int>(uVar2,uVar3,uVar4);
  }
  uVar1 = med3char<unsigned_int>(uVar1,b,c);
  return uVar1;
}

Assistant:

CharT
pseudo_median(unsigned char** strings, size_t N, size_t depth)
{
	if (N > 30)
		return med3char(
			med3char(
				get_char<CharT>(strings[0], depth),
				get_char<CharT>(strings[1], depth),
				get_char<CharT>(strings[2], depth)
				),
			med3char(
				get_char<CharT>(strings[N/2  ], depth),
				get_char<CharT>(strings[N/2+1], depth),
				get_char<CharT>(strings[N/2+2], depth)
				),
			med3char(
				get_char<CharT>(strings[N-3], depth),
				get_char<CharT>(strings[N-2], depth),
				get_char<CharT>(strings[N-1], depth)
				)
		       );
	else
		return med3char(get_char<CharT>(strings[0  ], depth),
				get_char<CharT>(strings[N/2], depth),
				get_char<CharT>(strings[N-1], depth));
}